

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

IRet * __thiscall
vkt::shaderexecutor::Cond<tcu::Vector<float,_3>_>::doApply
          (IRet *__return_storage_ptr__,Cond<tcu::Vector<float,_3>_> *this,EvalContext *param_1,
          IArgs *iargs)

{
  Interval *pIVar1;
  bool bVar2;
  IVal local_e8;
  Interval local_a0;
  IVal local_88;
  Interval local_40;
  IArgs *local_28;
  IArgs *iargs_local;
  EvalContext *param_1_local;
  Cond<tcu::Vector<float,_3>_> *this_local;
  IRet *ret;
  
  local_28 = iargs;
  iargs_local = (IArgs *)param_1;
  param_1_local = (EvalContext *)this;
  this_local = (Cond<tcu::Vector<float,_3>_> *)__return_storage_ptr__;
  tcu::Vector<tcu::Interval,_3>::Vector(__return_storage_ptr__);
  pIVar1 = local_28->a;
  tcu::Interval::Interval(&local_40,1.0);
  bVar2 = tcu::Interval::contains(pIVar1,&local_40);
  if (bVar2) {
    unionIVal<tcu::Vector<float,3>>
              (&local_88,(shaderexecutor *)__return_storage_ptr__,local_28->b,(IVal *)iargs);
    memcpy(__return_storage_ptr__,&local_88,0x48);
  }
  pIVar1 = local_28->a;
  tcu::Interval::Interval(&local_a0,0.0);
  bVar2 = tcu::Interval::contains(pIVar1,&local_a0);
  if (bVar2) {
    unionIVal<tcu::Vector<float,3>>
              (&local_e8,(shaderexecutor *)__return_storage_ptr__,local_28->c,(IVal *)iargs);
    memcpy(__return_storage_ptr__,&local_e8,0x48);
  }
  return __return_storage_ptr__;
}

Assistant:

IRet	doApply	(const EvalContext&, const IArgs& iargs)const
	{
		IRet	ret;

		if (iargs.a.contains(true))
			ret = unionIVal<T>(ret, iargs.b);

		if (iargs.a.contains(false))
			ret = unionIVal<T>(ret, iargs.c);

		return ret;
	}